

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

UChar * __thiscall
icu_63::ResourceDataValue::getAliasString
          (ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  uint uVar1;
  anon_struct_8_3_a62c8074 *paVar2;
  UChar *pUVar3;
  int32_t iVar4;
  
  iVar4 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return (UChar *)0x0;
  }
  if ((this->res & 0xf0000000) == 0x30000000) {
    uVar1 = this->res & 0xfffffff;
    if (uVar1 == 0) {
      paVar2 = &gEmptyString;
    }
    else {
      paVar2 = (anon_struct_8_3_a62c8074 *)((ulong)(uVar1 << 2) + (long)this->pResData->pRoot);
    }
    iVar4 = paVar2->length;
    pUVar3 = &paVar2->nul;
  }
  else {
    pUVar3 = (UChar *)0x0;
  }
  *length = iVar4;
  if (pUVar3 != (UChar *)0x0) {
    return pUVar3;
  }
  *errorCode = U_RESOURCE_TYPE_MISMATCH;
  return (UChar *)0x0;
}

Assistant:

const UChar *ResourceDataValue::getAliasString(int32_t &length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const UChar *s = res_getAlias(pResData, res, &length);
    if(s == NULL) {
        errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
    return s;
}